

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzgeoelrefpattern.h.h
# Opt level: O0

void __thiscall
TPZGeoElRefPattern<pzgeom::TPZGeoPyramid>::TPZGeoElRefPattern
          (TPZGeoElRefPattern<pzgeom::TPZGeoPyramid> *this,TPZGeoMesh *DestMesh,
          TPZGeoElRefPattern<pzgeom::TPZGeoPyramid> *cp)

{
  TPZGeoElRefLess<pzgeom::TPZGeoPyramid> *in_RDX;
  TPZGeoMesh *in_RSI;
  TPZVec<long> *in_RDI;
  TPZGeoElRefLess<pzgeom::TPZGeoPyramid> *unaff_retaddr;
  int64_t *this_00;
  pointer_____offset_0x60___ *copy;
  TPZVec<long> *vtt;
  
  vtt = in_RDI;
  TPZRegisterClassId::TPZRegisterClassId<TPZGeoElRefPattern<pzgeom::TPZGeoPyramid>>
            ((TPZRegisterClassId *)in_RDI,0x21);
  copy = &VTT;
  TPZSavable::TPZSavable((TPZSavable *)in_RDI,&PTR_PTR_0243eeb8);
  TPZGeoElRefLess<pzgeom::TPZGeoPyramid>::TPZGeoElRefLess
            (unaff_retaddr,&vtt->_vptr_TPZVec,in_RSI,in_RDX);
  in_RDI->_vptr_TPZVec = (_func_int **)&PTR__TPZGeoElRefPattern_0243eb90;
  in_RDI->_vptr_TPZVec = (_func_int **)&PTR__TPZGeoElRefPattern_0243eb90;
  this_00 = &in_RDI[0x11].fNAlloc;
  TPZVec<long>::TPZVec((TPZVec<long> *)this_00);
  TPZAutoPointer<TPZRefPattern>::TPZAutoPointer
            ((TPZAutoPointer<TPZRefPattern> *)this_00,
             (TPZAutoPointer<TPZRefPattern> *)&in_RDI[0x12].fNAlloc);
  TPZVec<long>::operator=(in_RDI,(TPZVec<long> *)copy);
  return;
}

Assistant:

TPZGeoElRefPattern<TGeo>::TPZGeoElRefPattern(TPZGeoMesh &DestMesh, const TPZGeoElRefPattern<TGeo> &cp):
TPZRegisterClassId(&TPZGeoElRefPattern<TGeo>::ClassId),TPZGeoElRefLess<TGeo>(DestMesh,cp),
fRefPattern(cp.fRefPattern) {

	this->fSubEl = cp.fSubEl;
}